

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_rle8_data(BmpDecoderImpl *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  value_type *pvVar7;
  long in_RDI;
  uint j_1;
  UInt8 *map_base_1;
  int i;
  uint j;
  UInt8 *map_base;
  int c;
  int k;
  int nx;
  uint dy;
  uint dx;
  int x;
  bool painting;
  int c2;
  int c1;
  UInt8 *mover;
  UInt8 *base;
  uint image_size;
  uint line_size;
  uint ncomp;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_6c;
  int local_60;
  uint local_5c;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  value_type *local_28;
  
  uVar2 = 3;
  if ((*(byte *)(in_RDI + 0x274) & 1) != 0) {
    uVar2 = 1;
  }
  uVar3 = *(int *)(in_RDI + 0x218) * uVar2;
  uVar4 = *(int *)(in_RDI + 0x21c) * uVar3;
  std::istream::seekg(in_RDI,*(_Ios_Seekdir *)(in_RDI + 0x210));
  void_vector<unsigned_char>::resize
            ((void_vector<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  local_28 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14f8db);
  local_28 = local_28 + ((ulong)uVar4 - (ulong)uVar3);
  pvVar7 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14f910);
  memset(pvVar7,0,(ulong)uVar4);
  bVar1 = true;
  local_38 = 0;
  while (bVar1) {
    iVar5 = std::istream::get();
    iVar6 = std::istream::get();
    if (iVar5 == 0) {
      if (iVar6 == 0) {
        local_28 = local_28 + -(ulong)(uVar3 + uVar2 * local_38);
        local_38 = 0;
      }
      else if (iVar6 == 1) {
        bVar1 = false;
      }
      else if (iVar6 == 2) {
        if (local_38 == *(int *)(in_RDI + 0x218)) {
          local_28 = local_28 + -(ulong)(uVar3 + uVar2 * local_38);
          local_38 = 0;
        }
        local_44 = std::istream::get();
        local_40 = std::istream::get();
        local_44 = local_38 + local_44;
        if (*(int *)(in_RDI + 0x218) < local_44) {
          local_40 = local_44 / *(int *)(in_RDI + 0x218) + 1 + local_40;
          local_44 = local_44 % *(int *)(in_RDI + 0x218);
        }
        local_28 = local_28 + uVar2 * (local_44 - local_38);
        local_38 = local_44;
        if (local_40 != 0) {
          local_28 = local_28 + -(ulong)(uVar3 * local_40);
        }
      }
      else {
        for (local_48 = 0; local_48 < iVar6; local_48 = local_48 + 1) {
          iVar5 = std::istream::get();
          pvVar7 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14faf2);
          for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
            local_28[local_5c] = pvVar7[(ulong)local_5c + (long)(iVar5 * 3)];
          }
          local_28 = local_28 + uVar2;
        }
        if (iVar6 % 2 != 0) {
          std::istream::get();
        }
      }
    }
    else {
      for (local_60 = 0; local_60 < iVar5; local_60 = local_60 + 1) {
        pvVar7 = void_vector<unsigned_char>::data((void_vector<unsigned_char> *)0x14fba1);
        for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 1) {
          local_28[local_6c] = pvVar7[(ulong)local_6c + (long)(iVar6 * 3)];
        }
        local_28 = local_28 + uVar2;
      }
      local_38 = iVar5 + local_38;
    }
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_rle8_data ()
{
    // these are sizes for the final image
    const unsigned int ncomp = grayscale ? 1 : 3;
    const unsigned int line_size = info_header.width * ncomp;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg (file_header.offset, std::ios::beg);

    // make room for the pixels
    pixels.resize (image_size);

    // setup the base pointer at the beginning of the last line.
    UInt8 * base = pixels.data() + image_size - line_size;
    UInt8 * mover = base;

    // set the image's background color to black.
    VIGRA_CSTD::memset (pixels.data (), 0, image_size);

    // read the rle codes one by one.
    int c1, c2;
    bool painting = true;

    int x = 0;

    while (painting) {

        c1 = stream.get ();
        c2 = stream.get ();

        if (c1 == 0x00) {

            // escape sequences
            switch (c2) {
            case 0x00:
                {
                    // end of line

                    // finished painting this line, move the pointer to
                    // the beginning of the previous line, which is the
                    // next bmp line.
                    // we need to go back to the beginning of this line,
                    // and another additional line back.
                    mover -= line_size + ncomp*x;

                    // so we are at the beginning of the next bmp line.
                    x = 0;

                    break;
                }
            case 0x01:
                {
                    // end of bitmap
                    painting = false;
                    break;
                }
            case 0x02:
                {
                    // "delta" movement

                    // handle the end-of-line case.
                    if (x == info_header.width) {
                        mover -= line_size + ncomp*x;
                        x = 0;
                    }

                    unsigned int dx = stream.get ();
                    unsigned int dy = stream.get ();
                    int nx = x + dx;

                    // x movement.
                    if (nx > info_header.width) {
                        dy += nx / info_header.width + 1;
                        nx %= info_header.width;
                    }
                    mover += ncomp*(nx-x);
                    x = nx;

                    // y movement.
                    if (dy != 0) {
                        mover -= line_size*dy;
                    }
                    break;
                }
            default:

                // absolute mode. paint the following c2 bytes.
                // then, eventually skip one byte to respect 16 bit boundaries.
                for (int k = 0; k < c2; ++k) {
                    const int c = stream.get ();
                    const UInt8 *map_base = map.data () + 3*c;
                    for (unsigned int j = 0; j < ncomp; ++j)
                        mover [j] = map_base [j];
                    mover += ncomp;
                }
                if (c2 % 2)
                    stream.get ();
            }

        } else {

            // plain rle: repeat c2 mapped, c1 times.
            // a line break may not happen here.
            for (int i = 0; i < c1; ++i) {
                const UInt8 *map_base = map.data () + 3*c2;
                for (unsigned int j = 0; j < ncomp; ++j)
                    mover [j] = map_base [j];
                mover += ncomp;
            }
            x += c1;
        }
    }
}